

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O0

void __thiscall
Pl_PNGFilter::Pl_PNGFilter
          (Pl_PNGFilter *this,char *identifier,Pipeline *next,action_e action,uint columns,
          uint samples_per_pixel,uint bits_per_sample)

{
  uint uVar1;
  logic_error *this_00;
  runtime_error *prVar2;
  element_type *peVar3;
  uint local_b4;
  shared_ptr<unsigned_char> local_68;
  shared_ptr<unsigned_char> local_58;
  ulong local_48;
  unsigned_long_long bpr;
  uint local_2c;
  uint local_28;
  uint samples_per_pixel_local;
  uint columns_local;
  action_e action_local;
  Pipeline *next_local;
  char *identifier_local;
  Pl_PNGFilter *this_local;
  
  local_2c = samples_per_pixel;
  local_28 = columns;
  samples_per_pixel_local = action;
  _columns_local = next;
  next_local = (Pipeline *)identifier;
  identifier_local = (char *)this;
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_PNGFilter_0058b4d0;
  this->action = samples_per_pixel_local;
  this->cur_row = (uchar *)0x0;
  this->prev_row = (uchar *)0x0;
  std::shared_ptr<unsigned_char>::shared_ptr(&this->buf1);
  std::shared_ptr<unsigned_char>::shared_ptr(&this->buf2);
  this->pos = 0;
  this->incoming = 0;
  if (_columns_local == (Pipeline *)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Attempt to create Pl_PNGFilter with nullptr as next");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (local_2c == 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"PNGFilter created with invalid samples_per_pixel");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((((bits_per_sample != 1) && (bits_per_sample != 2)) && (bits_per_sample != 4)) &&
     ((bits_per_sample != 8 && (bits_per_sample != 0x10)))) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar2,"PNGFilter created with invalid bits_per_sample not 1, 2, 4, 8, or 16");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->bytes_per_pixel = bits_per_sample * local_2c + 7 >> 3;
  uVar1 = local_28 * bits_per_sample * local_2c + 7 >> 3;
  local_48 = (ulong)uVar1;
  if ((local_48 != 0) && (local_48 < 0xffffffff)) {
    if (((anonymous_namespace)::memory_limit != 0) &&
       ((anonymous_namespace)::memory_limit >> 1 < local_48)) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"PNGFilter memory limit exceeded");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->bytes_per_row = uVar1;
    QUtil::make_shared_array<unsigned_char>((QUtil *)&local_58,(ulong)(this->bytes_per_row + 1));
    std::shared_ptr<unsigned_char>::operator=(&this->buf1,&local_58);
    std::shared_ptr<unsigned_char>::~shared_ptr(&local_58);
    QUtil::make_shared_array<unsigned_char>((QUtil *)&local_68,(ulong)(this->bytes_per_row + 1));
    std::shared_ptr<unsigned_char>::operator=(&this->buf2,&local_68);
    std::shared_ptr<unsigned_char>::~shared_ptr(&local_68);
    peVar3 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(this->buf1).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>)
    ;
    memset(peVar3,0,(ulong)(this->bytes_per_row + 1));
    peVar3 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(this->buf2).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>)
    ;
    memset(peVar3,0,(ulong)(this->bytes_per_row + 1));
    peVar3 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(this->buf1).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>)
    ;
    this->cur_row = peVar3;
    peVar3 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(this->buf2).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>)
    ;
    this->prev_row = peVar3;
    if (samples_per_pixel_local == 0) {
      local_b4 = this->bytes_per_row;
    }
    else {
      local_b4 = this->bytes_per_row + 1;
    }
    this->incoming = (ulong)local_b4;
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"PNGFilter created with invalid columns value");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Pl_PNGFilter::Pl_PNGFilter(
    char const* identifier,
    Pipeline* next,
    action_e action,
    unsigned int columns,
    unsigned int samples_per_pixel,
    unsigned int bits_per_sample) :
    Pipeline(identifier, next),
    action(action)
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_PNGFilter with nullptr as next");
    }
    if (samples_per_pixel < 1) {
        throw std::runtime_error("PNGFilter created with invalid samples_per_pixel");
    }
    if (!((bits_per_sample == 1) || (bits_per_sample == 2) || (bits_per_sample == 4) ||
          (bits_per_sample == 8) || (bits_per_sample == 16))) {
        throw std::runtime_error(
            "PNGFilter created with invalid bits_per_sample not 1, 2, 4, 8, or 16");
    }
    this->bytes_per_pixel = ((bits_per_sample * samples_per_pixel) + 7) / 8;
    unsigned long long bpr = ((columns * bits_per_sample * samples_per_pixel) + 7) / 8;
    if ((bpr == 0) || (bpr > (UINT_MAX - 1))) {
        throw std::runtime_error("PNGFilter created with invalid columns value");
    }
    if (memory_limit > 0 && bpr > (memory_limit / 2U)) {
        throw std::runtime_error("PNGFilter memory limit exceeded");
    }
    this->bytes_per_row = bpr & UINT_MAX;
    this->buf1 = QUtil::make_shared_array<unsigned char>(this->bytes_per_row + 1);
    this->buf2 = QUtil::make_shared_array<unsigned char>(this->bytes_per_row + 1);
    memset(this->buf1.get(), 0, this->bytes_per_row + 1);
    memset(this->buf2.get(), 0, this->bytes_per_row + 1);
    this->cur_row = this->buf1.get();
    this->prev_row = this->buf2.get();

    // number of bytes per incoming row
    this->incoming = (action == a_encode ? this->bytes_per_row : this->bytes_per_row + 1);
}